

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)30,_(unsigned_short)16>::Pack
               (uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar1 = in[0x11];
  *out = (uint)uVar1 << 0x1e | (uint)in[0x10] & 0x3fffffff;
  uVar2 = in[0x12];
  out[1] = (uint)uVar2 << 0x1c | (uint)uVar1 >> 2 & 0xfffffff;
  out[2] = (uint)uVar2 >> 4 & 0x3ffffff;
  Unroller<(unsigned_short)30,_(unsigned_short)19>::Pack(in,out + 2);
  return;
}

Assistant:

static void Pack(const uint64_t *__restrict in, uint32_t *__restrict out) {
		pack_single_in64<DELTA, (DELTA * OINDEX) % 32, (1ULL << DELTA) - 1>(in[OINDEX], out);

		Unroller<DELTA, OINDEX + 1>::Pack(in, out);
	}